

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

double __thiscall NJamSpell::TLangModel::GetGram2Prob(TLangModel *this,TWordId word1,TWordId word2)

{
  TCount TVar1;
  pair<unsigned_int,_unsigned_int> key;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  if (this->UnknownWordId == word1) {
    dVar3 = 0.0;
  }
  else {
    TVar1 = GetGramHashCount<unsigned_int>(word1,&this->PerfectHash,&this->Buckets);
    dVar3 = (double)TVar1;
    if (this->UnknownWordId == word2 || this->UnknownWordId == word1) {
      dVar2 = 0.0;
    }
    else {
      key.second = word2;
      key.first = word1;
      TVar1 = GetGramHashCount<std::pair<unsigned_int,unsigned_int>>
                        (key,&this->PerfectHash,&this->Buckets);
      dVar2 = (double)TVar1;
    }
  }
  return ((double)(~-(ulong)(dVar3 < dVar2) & (ulong)dVar2) + this->K) /
         ((double)this->TotalWords + dVar3);
}

Assistant:

double TLangModel::GetGram2Prob(TWordId word1, TWordId word2) const {
    double countsGram1 = GetGram1HashCount(word1);
    double countsGram2 = GetGram2HashCount(word1, word2);
    if (countsGram2 > countsGram1) { // (hash collision)
        countsGram2 = 0;
    }
    countsGram1 += TotalWords;
    countsGram2 += K;
    return countsGram2 / countsGram1;
}